

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

void anon_unknown.dwarf_8df1c::OnMemoryLimitHit(void *context)

{
  ExpressionContext *ctx;
  void *context_local;
  
  (**(code **)(**(long **)((long)context + 0x8a50) + 0x28))();
  if (*(long *)(*(long *)((long)context + 0x8158) + 0x18) == 0) {
    Stop((ExpressionContext *)context,
         (SynBase *)**(undefined8 **)(*(long *)((long)context + 0x8a20) + 0x68),
         "ERROR: memory limit (%u) reached during compilation (analyze stage)",
         (ulong)*(uint *)((long)context + 0x85e4));
  }
  else {
    Stop((ExpressionContext *)context,
         (SynBase *)**(undefined8 **)(*(long *)((long)context + 0x8158) + 0x18),
         "ERROR: memory limit (%u) reached during compilation (analyze stage)",
         (ulong)*(uint *)((long)context + 0x85e4));
  }
  return;
}

Assistant:

void OnMemoryLimitHit(void *context)
	{
		ExpressionContext &ctx = *(ExpressionContext*)context;

		ctx.allocator->clear_limit();

		if(ctx.scope->ownerFunction)
			Stop(ctx, ctx.scope->ownerFunction->source, "ERROR: memory limit (%u) reached during compilation (analyze stage)", ctx.memoryLimit);
		else
			Stop(ctx, ctx.typeAutoRef->members.head->source, "ERROR: memory limit (%u) reached during compilation (analyze stage)", ctx.memoryLimit);
	}